

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

int __thiscall
icu_63::UnifiedCache::_poll(UnifiedCache *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  UBool UVar1;
  undefined8 extraout_RAX;
  undefined4 in_register_0000000c;
  bool bVar2;
  UHashElement *local_40;
  UHashElement *element;
  Mutex lock;
  UErrorCode *status_local;
  SharedObject **value_local;
  CacheKeyBase *key_local;
  UnifiedCache *this_local;
  
  lock.fMutex = (UMutex *)CONCAT44(in_register_0000000c,__timeout);
  Mutex::Mutex((Mutex *)&element,&gCacheMutex);
  local_40 = uhash_find_63(this->fHashtable,__fds);
  while( true ) {
    bVar2 = false;
    if (local_40 != (UHashElement *)0x0) {
      UVar1 = _inProgress(this,local_40);
      bVar2 = UVar1 != '\0';
    }
    if (!bVar2) break;
    umtx_condWait_63(&gInProgressValueAddedCond,&gCacheMutex);
    local_40 = uhash_find_63(this->fHashtable,__fds);
  }
  if (local_40 == (UHashElement *)0x0) {
    _putNew(this,(CacheKeyBase *)__fds,this->fNoValue,U_ZERO_ERROR,(UErrorCode *)lock.fMutex);
  }
  else {
    _fetch(this,local_40,(SharedObject **)__nfds,(UErrorCode *)lock.fMutex);
  }
  this_local._7_1_ = local_40 != (UHashElement *)0x0;
  Mutex::~Mutex((Mutex *)&element);
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_);
}

Assistant:

UBool UnifiedCache::_poll(
        const CacheKeyBase &key,
        const SharedObject *&value,
        UErrorCode &status) const {
    U_ASSERT(value == NULL);
    U_ASSERT(status == U_ZERO_ERROR);
    Mutex lock(&gCacheMutex);
    const UHashElement *element = uhash_find(fHashtable, &key);

    // If the hash table contains an inProgress placeholder entry for this key,
    // this means that another thread is currently constructing the value object.
    // Loop, waiting for that construction to complete.
     while (element != NULL && _inProgress(element)) {
        umtx_condWait(&gInProgressValueAddedCond, &gCacheMutex);
        element = uhash_find(fHashtable, &key);
    }

    // If the hash table contains an entry for the key,
    // fetch out the contents and return them.
    if (element != NULL) {
         _fetch(element, value, status);
        return TRUE;
    }

    // The hash table contained nothing for this key.
    // Insert an inProgress place holder value.
    // Our caller will create the final value and update the hash table.
    _putNew(key, fNoValue, U_ZERO_ERROR, status);
    return FALSE;
}